

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

void fts5SegIterNext(Fts5Index *p,Fts5SegIter *pIter,int *pbNewTerm)

{
  u8 *puVar1;
  ushort *puVar2;
  Fts5Hash *pHash;
  Fts5Data *pFVar3;
  bool bVar4;
  u8 *pData;
  byte bVar5;
  ushort uVar6;
  int iVar7;
  int iVar8;
  size_t sVar9;
  uint uVar10;
  long lVar11;
  int iOff;
  u64 iDelta;
  int nList;
  int nKeep;
  char *zTerm;
  u32 local_5c;
  u8 *local_58;
  int local_50;
  u32 local_4c;
  int *local_48;
  u8 *local_40;
  int *local_38;
  
  local_4c = 0;
  puVar1 = pIter->pLeaf->p;
  iVar7 = pIter->pLeaf->szLeaf;
  lVar11 = (long)pIter->nPos + (long)pIter->iLeafOffset;
  uVar10 = (uint)lVar11;
  local_5c = uVar10;
  local_48 = pbNewTerm;
  if ((int)uVar10 < iVar7) {
    if ((int)uVar10 < pIter->iEndofDoclist) {
      bVar5 = sqlite3Fts5GetVarint(puVar1 + (int)uVar10,(u64 *)&local_58);
      local_5c = bVar5 + uVar10;
      pIter->iRowid = (i64)(local_58 + pIter->iRowid);
      bVar4 = false;
    }
    else {
      sqlite3Fts5GetVarint32(puVar1 + iVar7,(u32 *)&local_58);
      bVar4 = true;
      if (uVar10 != (uint)local_58) {
        iVar7 = sqlite3Fts5GetVarint32(puVar1 + lVar11,&local_4c);
        local_5c = iVar7 + uVar10;
      }
    }
    pIter->iLeafOffset = local_5c;
  }
  else if (pIter->pSeg == (Fts5StructureSegment *)0x0) {
    local_58 = (uchar *)0x0;
    local_40 = (u8 *)0x0;
    local_50 = 0;
    if ((pIter->flags & 1) == 0) {
      pHash = p->pHash;
      pHash->pScan = pHash->pScan->pScanNext;
      sqlite3Fts5HashScanEntry(pHash,(char **)&local_40,&local_58,&local_50);
    }
    pData = local_40;
    puVar1 = local_58;
    pFVar3 = pIter->pLeaf;
    if (local_58 == (uchar *)0x0) {
      sqlite3_free(pFVar3);
      pIter->pLeaf = (Fts5Data *)0x0;
    }
    else {
      pFVar3->p = local_58;
      pFVar3->nn = local_50;
      pFVar3->szLeaf = local_50;
      pIter->iEndofDoclist = local_50 + 1;
      sVar9 = strlen((char *)local_40);
      (pIter->term).n = 0;
      sqlite3Fts5BufferAppendBlob(&p->rc,&pIter->term,(u32)sVar9,pData);
      bVar5 = sqlite3Fts5GetVarint(puVar1,(u64 *)&pIter->iRowid);
      pIter->iLeafOffset = (uint)bVar5;
      *local_48 = 1;
    }
    bVar4 = false;
  }
  else {
    local_5c = 0;
    local_38 = &pIter->iEndofDoclist;
    bVar4 = false;
    while (local_5c == 0) {
      fts5SegIterNextPage(p,pIter);
      pFVar3 = pIter->pLeaf;
      if (pFVar3 == (Fts5Data *)0x0) break;
      puVar2 = (ushort *)pFVar3->p;
      uVar6 = *puVar2 << 8 | *puVar2 >> 8;
      local_5c = (u32)uVar6;
      if ((uVar6 == 0) || (pFVar3->szLeaf <= (int)(uint)uVar6)) {
        iVar7 = pFVar3->szLeaf;
        if (iVar7 < pFVar3->nn) {
          iVar8 = sqlite3Fts5GetVarint32((uchar *)((long)puVar2 + (long)iVar7),&local_5c);
          pIter->iPgidxOff = iVar8 + iVar7;
          pIter->iLeafOffset = local_5c;
          pIter->iEndofDoclist = local_5c;
          bVar4 = true;
        }
      }
      else {
        bVar5 = sqlite3Fts5GetVarint((uchar *)((long)puVar2 + (ulong)uVar6),(u64 *)&pIter->iRowid);
        local_5c = (uint)bVar5 + (uint)uVar6;
        pIter->iLeafOffset = local_5c;
        iVar7 = pFVar3->szLeaf;
        if (iVar7 < pFVar3->nn) {
          iVar8 = sqlite3Fts5GetVarint32(pFVar3->p + iVar7,(u32 *)local_38);
          pIter->iPgidxOff = iVar8 + iVar7;
        }
      }
      if (pFVar3->szLeaf < (int)local_5c) {
        p->rc = 0x10b;
        return;
      }
    }
  }
  pFVar3 = pIter->pLeaf;
  if (pFVar3 != (Fts5Data *)0x0) {
    if (bVar4) {
      if ((pIter->flags & 1) == 0) {
        fts5SegIterLoadTerm(p,pIter,local_4c);
        fts5SegIterLoadNPos(p,pIter);
        if (local_48 != (int *)0x0) {
          *local_48 = 1;
        }
      }
      else {
        sqlite3_free(pFVar3);
        pIter->pLeaf = (Fts5Data *)0x0;
      }
    }
    else {
      puVar1 = pFVar3->p;
      iVar7 = pIter->iLeafOffset;
      pIter->iLeafOffset = iVar7 + 1;
      bVar5 = puVar1[iVar7];
      local_58 = (u8 *)CONCAT44(local_58._4_4_,(uint)bVar5);
      if ((char)bVar5 < '\0') {
        pIter->iLeafOffset = iVar7;
        iVar8 = sqlite3Fts5GetVarint32(puVar1 + iVar7,(u32 *)&local_58);
        pIter->iLeafOffset = iVar8 + iVar7;
      }
      pIter->bDel = (byte)local_58 & 1;
      pIter->nPos = (int)(uint)local_58 >> 1;
    }
  }
  return;
}

Assistant:

static void fts5SegIterNext(
  Fts5Index *p,                   /* FTS5 backend object */
  Fts5SegIter *pIter,             /* Iterator to advance */
  int *pbNewTerm                  /* OUT: Set for new term */
){
  Fts5Data *pLeaf = pIter->pLeaf;
  int iOff;
  int bNewTerm = 0;
  int nKeep = 0;
  u8 *a;
  int n;

  assert( pbNewTerm==0 || *pbNewTerm==0 );
  assert( p->pConfig->eDetail!=FTS5_DETAIL_NONE );

  /* Search for the end of the position list within the current page. */
  a = pLeaf->p;
  n = pLeaf->szLeaf;

  ASSERT_SZLEAF_OK(pLeaf);
  iOff = pIter->iLeafOffset + pIter->nPos;

  if( iOff<n ){
    /* The next entry is on the current page. */
    assert_nc( iOff<=pIter->iEndofDoclist );
    if( iOff>=pIter->iEndofDoclist ){
      bNewTerm = 1;
      if( iOff!=fts5LeafFirstTermOff(pLeaf) ){
        iOff += fts5GetVarint32(&a[iOff], nKeep);
      }
    }else{
      u64 iDelta;
      iOff += sqlite3Fts5GetVarint(&a[iOff], &iDelta);
      pIter->iRowid += iDelta;
      assert_nc( iDelta>0 );
    }
    pIter->iLeafOffset = iOff;

  }else if( pIter->pSeg==0 ){
    const u8 *pList = 0;
    const char *zTerm = 0;
    int nList = 0;
    assert( (pIter->flags & FTS5_SEGITER_ONETERM) || pbNewTerm );
    if( 0==(pIter->flags & FTS5_SEGITER_ONETERM) ){
      sqlite3Fts5HashScanNext(p->pHash);
      sqlite3Fts5HashScanEntry(p->pHash, &zTerm, &pList, &nList);
    }
    if( pList==0 ){
      fts5DataRelease(pIter->pLeaf);
      pIter->pLeaf = 0;
    }else{
      pIter->pLeaf->p = (u8*)pList;
      pIter->pLeaf->nn = nList;
      pIter->pLeaf->szLeaf = nList;
      pIter->iEndofDoclist = nList+1;
      sqlite3Fts5BufferSet(&p->rc, &pIter->term, (int)strlen(zTerm),
          (u8*)zTerm);
      pIter->iLeafOffset = fts5GetVarint(pList, (u64*)&pIter->iRowid);
      *pbNewTerm = 1;
    }
  }else{
    iOff = 0;
    /* Next entry is not on the current page */
    while( iOff==0 ){
      fts5SegIterNextPage(p, pIter);
      pLeaf = pIter->pLeaf;
      if( pLeaf==0 ) break;
      ASSERT_SZLEAF_OK(pLeaf);
      if( (iOff = fts5LeafFirstRowidOff(pLeaf)) && iOff<pLeaf->szLeaf ){
        iOff += sqlite3Fts5GetVarint(&pLeaf->p[iOff], (u64*)&pIter->iRowid);
        pIter->iLeafOffset = iOff;

        if( pLeaf->nn>pLeaf->szLeaf ){
          pIter->iPgidxOff = pLeaf->szLeaf + fts5GetVarint32(
              &pLeaf->p[pLeaf->szLeaf], pIter->iEndofDoclist
          );
        }
      }
      else if( pLeaf->nn>pLeaf->szLeaf ){
        pIter->iPgidxOff = pLeaf->szLeaf + fts5GetVarint32(
            &pLeaf->p[pLeaf->szLeaf], iOff
        );
        pIter->iLeafOffset = iOff;
        pIter->iEndofDoclist = iOff;
        bNewTerm = 1;
      }
      assert_nc( iOff<pLeaf->szLeaf );
      if( iOff>pLeaf->szLeaf ){
        p->rc = FTS5_CORRUPT;
        return;
      }
    }
  }

  /* Check if the iterator is now at EOF. If so, return early. */
  if( pIter->pLeaf ){
    if( bNewTerm ){
      if( pIter->flags & FTS5_SEGITER_ONETERM ){
        fts5DataRelease(pIter->pLeaf);
        pIter->pLeaf = 0;
      }else{
        fts5SegIterLoadTerm(p, pIter, nKeep);
        fts5SegIterLoadNPos(p, pIter);
        if( pbNewTerm ) *pbNewTerm = 1;
      }
    }else{
      /* The following could be done by calling fts5SegIterLoadNPos(). But
      ** this block is particularly performance critical, so equivalent
      ** code is inlined. 
      **
      ** Later: Switched back to fts5SegIterLoadNPos() because it supports
      ** detail=none mode. Not ideal.
      */
      int nSz;
      assert( p->rc==SQLITE_OK );
      assert( pIter->iLeafOffset<=pIter->pLeaf->nn );
      fts5FastGetVarint32(pIter->pLeaf->p, pIter->iLeafOffset, nSz);
      pIter->bDel = (nSz & 0x0001);
      pIter->nPos = nSz>>1;
      assert_nc( pIter->nPos>=0 );
    }
  }
}